

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::Expression> __thiscall
mocker::Parser::primaryExpr(Parser *this,TokIter *iter,TokIter end)

{
  Position *pPVar1;
  size_t sVar2;
  pointer psVar3;
  TokIter TVar4;
  TokenID TVar5;
  mapped_type *pmVar6;
  SyntaxError *pSVar7;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<mocker::ast::Expression> sVar9;
  Position beg;
  Position begPos;
  GetTokenID id;
  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
  args;
  shared_ptr<mocker::ast::Identifier> ident;
  shared_ptr<mocker::ast::Identifier> local_58;
  Parser local_48;
  
  identifierExpr((Parser *)&begPos,iter,end);
  if (begPos.line == 0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&begPos.col);
    literalExpr((Parser *)&args,iter,end);
    if (args.
        super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &args.
                  super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      newExpr((Parser *)&args,iter,end);
      if (args.
          super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &args.
                    super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        Token::position(*end._M_current);
        begPos.line = (size_t)args.
                              super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
        begPos.col = (size_t)args.
                             super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
        TVar5 = GetTokenID::operator()(&id,*end._M_current);
        if (TVar5 == LeftParen) {
          *(long *)end._M_current = *(long *)end._M_current + 0x38;
          assignmentExpr(this,iter,end);
          if ((this->tokBeg)._M_current == (Token *)0x0) {
            pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x48);
            Token::position(*end._M_current);
            SyntaxError::SyntaxError
                      (pSVar7,&begPos,
                       (Position *)
                       &args.
                        super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __cxa_throw(pSVar7,&SyntaxError::typeinfo,CompileError::~CompileError);
          }
          TVar5 = GetTokenID::operator()(&id,*end._M_current);
          if (TVar5 != RightParen) {
            pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x48);
            Token::position(*end._M_current);
            SyntaxError::SyntaxError
                      (pSVar7,&begPos,
                       (Position *)
                       &args.
                        super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __cxa_throw(pSVar7,&SyntaxError::typeinfo,CompileError::~CompileError);
          }
          *(long *)end._M_current = *(long *)end._M_current + 0x38;
          _Var8._M_pi = extraout_RDX_01;
        }
        else {
          (this->tokBeg)._M_current = (Token *)0x0;
          (this->tokEnd)._M_current = (Token *)0x0;
          _Var8._M_pi = extraout_RDX_00;
        }
        goto LAB_001709db;
      }
    }
    psVar3 = args.
             super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->tokBeg)._M_current =
         (Token *)args.
                  super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (Position *)&args;
    args.
    super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->tokEnd)._M_current = (Token *)psVar3;
    args.
    super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    TVar5 = GetTokenID::operator()(&id,*end._M_current);
    sVar2 = begPos.col;
    if (TVar5 == LeftParen) {
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
      std::__shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2> *)
                 (begPos.line + 0x18));
      exprList(&args,(Parser *)iter,(TokIter *)end._M_current,in_RCX);
      TVar5 = GetTokenID::operator()(&id,*end._M_current);
      if (TVar5 != RightParen) {
        __assert_fail("id(iter) == TokenID::RightParen",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0xb6,
                      "std::shared_ptr<ast::Expression> mocker::Parser::primaryExpr(TokIter &, TokIter)"
                     );
      }
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
      local_48.pos = (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                      *)ident.
                        super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
      pmVar6 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)iter[2]._M_current,(key_type *)&local_48.pos);
      local_58.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_58.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      beg.col = (pmVar6->first).line;
      beg.line = (size_t)iter;
      makeNode<mocker::ast::FuncCallExpr,std::shared_ptr<mocker::ast::Expression>,std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::Expression>,std::allocator<std::shared_ptr<mocker::ast::Expression>>>>
                (&local_48,beg,*(Position *)&(pmVar6->first).col,
                 (shared_ptr<mocker::ast::Expression> *)(pmVar6->second).col,&local_58,
                 (vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  *)&ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>);
      TVar4._M_current = local_48.tokEnd._M_current;
      local_48.tokEnd._M_current = (Token *)0x0;
      (this->tokBeg)._M_current = local_48.tokBeg._M_current;
      (this->tokEnd)._M_current = TVar4._M_current;
      local_48.tokBeg._M_current = (Token *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48.tokEnd);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
      ::~vector(&args);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      begPos.col = 0;
      (this->tokBeg)._M_current = (Token *)begPos.line;
      (this->tokEnd)._M_current = (Token *)sVar2;
      begPos.line = 0;
    }
    pPVar1 = &begPos;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pPVar1->col);
  _Var8._M_pi = extraout_RDX;
LAB_001709db:
  sVar9.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar9.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Expression>)
         sVar9.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Expression> Parser::primaryExpr(TokIter &iter,
                                                     TokIter end) {
  auto id = GetTokenID(end);
  if (auto identExpr = identifierExpr(iter, end)) {
    if (id(iter) != TokenID::LeftParen)
      return identExpr;
    ++iter;
    auto ident = identExpr->identifier;
    auto args = exprList(iter, end);
    assert(id(iter) == TokenID::RightParen);
    ++iter;
    return makeNode<ast::FuncCallExpr>(
        pos[ident->getID()], std::shared_ptr<ast::Expression>(nullptr),
        std::move(ident), std::move(args));
  }
  if (auto res = literalExpr(iter, end))
    return res;
  if (auto res = newExpr(iter, end))
    return res;

  auto begPos = iter->position().first;
  if (id(iter) != TokenID::LeftParen)
    return nullptr;
  ++iter;
  auto expr = expression(iter, end);
  if (!expr)
    throw SyntaxError(begPos, iter->position().second);
  if (id(iter) != TokenID::RightParen)
    throw SyntaxError(begPos, iter->position().second);
  ++iter;
  return expr;
}